

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

bool __thiscall
lunasvg::SVGPatternElement::applyPaint(SVGPatternElement *this,SVGRenderState *state,float opacity)

{
  undefined1 auVar1 [16];
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  float tx;
  float ty;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float sx;
  float sy;
  int extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  float in_XMM1_Db;
  shared_ptr<lunasvg::Canvas> patternImage;
  Transform patternImageTransform;
  Transform patternTransform;
  SVGPatternAttributes attributes;
  LengthContext lengthContext;
  Transform currentTransform;
  undefined1 local_158 [20];
  int iStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  plutovg_matrix_t local_130;
  Transform local_118;
  SVGPatternAttributes local_f8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  SVGRenderState local_90;
  LengthContext local_50;
  Transform local_40;
  
  bVar2 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (bVar2) {
    return false;
  }
  collectPatternAttributes(&local_f8,this);
  bVar2 = local_f8.m_patternContentElement != (SVGPatternElement *)0x0;
  if (local_f8.m_patternContentElement == (SVGPatternElement *)0x0) {
    return bVar2;
  }
  local_50.m_units = ((local_f8.m_patternUnits)->m_patternUnits).super_SVGProperty.field_0x9;
  local_50.m_element = (SVGElement *)this;
  tx = LengthContext::valueForLength
                 (&local_50,(Length *)&((local_f8.m_x)->m_x).super_SVGProperty.field_0xc,
                  ((local_f8.m_x)->m_x).super_SVGProperty.field_0x9);
  ty = LengthContext::valueForLength
                 (&local_50,(Length *)&((local_f8.m_y)->m_y).super_SVGProperty.field_0xc,
                  ((local_f8.m_y)->m_y).super_SVGProperty.field_0x9);
  fVar3 = LengthContext::valueForLength
                    (&local_50,(Length *)&((local_f8.m_width)->m_width).super_SVGProperty.field_0xc,
                     ((local_f8.m_width)->m_width).super_SVGProperty.field_0x9);
  fVar4 = LengthContext::valueForLength
                    (&local_50,
                     (Length *)&((local_f8.m_height)->m_height).super_SVGProperty.field_0xc,
                     ((local_f8.m_height)->m_height).super_SVGProperty.field_0x9);
  if (((local_f8.m_patternUnits)->m_patternUnits).super_SVGProperty.field_0x9 == '\x01') {
    iStack_144 = extraout_XMM0_Db;
    local_158._16_4_ = fVar4;
    uStack_140 = extraout_XMM0_Dc;
    uStack_13c = extraout_XMM0_Dd;
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
    tx = tx * in_XMM1_Da + extraout_XMM0_Da;
    ty = ty * in_XMM1_Db + extraout_XMM0_Db_00;
    fVar3 = fVar3 * in_XMM1_Da;
    fVar4 = (float)local_158._16_4_ * in_XMM1_Db;
  }
  Transform::operator*
            (&local_40,
             (Transform *)
             &((local_f8.m_patternTransform)->m_patternTransform).super_SVGProperty.field_0xc,
             &state->m_currentTransform);
  sx = Transform::xScale(&local_40);
  sy = Transform::yScale(&local_40);
  auVar1._4_4_ = ty;
  auVar1._0_4_ = tx;
  auVar1._8_4_ = fVar3;
  auVar1._12_4_ = fVar4;
  uStack_140 = fVar3;
  unique0x100001e2 = auVar1._8_8_;
  uStack_13c = fVar4;
  local_a8 = fVar4;
  fStack_a4 = fVar4;
  fStack_a0 = fVar4;
  fStack_9c = fVar4;
  Canvas::create((Canvas *)local_158,0.0,0.0,fVar3 * sx,fVar4 * sy);
  fVar3 = 0.0;
  fVar4 = sy;
  Transform::scaled((Transform *)&local_130,sx,sy);
  if (0.0 <= *(float *)&((local_f8.m_viewBox)->super_SVGFitToViewBox).m_viewBox.field_0x14) {
    fVar4 = 0.0;
    fVar3 = 0.0;
    if (0.0 <= *(float *)&((local_f8.m_viewBox)->super_SVGFitToViewBox).m_viewBox.field_0x18) {
      local_118.m_matrix.b = local_a8;
      local_118.m_matrix.a = (float)local_158._16_4_;
      SVGPreserveAspectRatio::getTransform
                ((Transform *)&local_90,
                 &((local_f8.m_preserveAspectRatio)->super_SVGFitToViewBox).m_preserveAspectRatio,
                 (Rect *)&((local_f8.m_viewBox)->super_SVGFitToViewBox).m_viewBox.super_SVGProperty.
                          field_0xc,(Size *)&local_118);
      Transform::multiply((Transform *)&local_130,(Transform *)&local_90);
      goto LAB_001183b3;
    }
  }
  if (((local_f8.m_patternContentUnits)->m_patternContentUnits).super_SVGProperty.field_0x9 ==
      '\x01') {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
    Transform::scale((Transform *)&local_130,fVar4,fVar3);
  }
LAB_001183b3:
  if ((plutovg_canvas_t *)local_158._8_8_ != (plutovg_canvas_t *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_158._8_8_ + 8) = *(int *)(local_158._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_158._8_8_ + 8) = *(int *)(local_158._8_8_ + 8) + 1;
    }
  }
  local_90.m_currentTransform.m_matrix.a = local_130.a;
  local_90.m_currentTransform.m_matrix.b = local_130.b;
  local_90.m_currentTransform.m_matrix.c = local_130.c;
  local_90.m_currentTransform.m_matrix.d = local_130.d;
  local_90.m_currentTransform.m_matrix.e = local_130.e;
  local_90.m_currentTransform.m_matrix.f = local_130.f;
  local_90.m_mode = Painting;
  local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_158._0_8_;
  local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
  local_90.m_element = (SVGElement *)this;
  local_90.m_parent = state;
  SVGElement::renderChildren((SVGElement *)local_f8.m_patternContentElement,&local_90);
  local_118.m_matrix._0_8_ =
       *(undefined8 *)
        &((local_f8.m_patternTransform)->m_patternTransform).super_SVGProperty.field_0xc;
  local_118.m_matrix.c = *(float *)&((local_f8.m_patternTransform)->m_patternTransform).field_0x14;
  local_118.m_matrix.d = *(float *)&((local_f8.m_patternTransform)->m_patternTransform).field_0x18;
  local_118.m_matrix.e = *(float *)&((local_f8.m_patternTransform)->m_patternTransform).field_0x1c;
  local_118.m_matrix.f = *(float *)&((local_f8.m_patternTransform)->m_patternTransform).field_0x20;
  Transform::translate(&local_118,tx,ty);
  Transform::scale(&local_118,1.0 / sx,1.0 / sy);
  Canvas::setTexture((state->m_canvas).
                     super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (Canvas *)local_158._0_8_,Tiled,opacity,&local_118);
  if ((plutovg_canvas_t *)
      local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (plutovg_canvas_t *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((plutovg_canvas_t *)local_158._8_8_ != (plutovg_canvas_t *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  return bVar2;
}

Assistant:

bool SVGPatternElement::applyPaint(SVGRenderState& state, float opacity) const
{
    if(state.hasCycleReference(this))
        return false;
    auto attributes = collectPatternAttributes();
    auto patternContentElement = attributes.patternContentElement();
    if(patternContentElement == nullptr)
        return false;
    LengthContext lengthContext(this, attributes.patternUnits());
    Rect patternRect = {
        lengthContext.valueForLength(attributes.x()),
        lengthContext.valueForLength(attributes.y()),
        lengthContext.valueForLength(attributes.width()),
        lengthContext.valueForLength(attributes.height())
    };

    if(attributes.patternUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternRect.x = patternRect.x * bbox.w + bbox.x;
        patternRect.y = patternRect.y * bbox.h + bbox.y;
        patternRect.w = patternRect.w * bbox.w;
        patternRect.h = patternRect.h * bbox.h;
    }

    auto currentTransform = attributes.patternTransform() * state.currentTransform();
    auto xScale = currentTransform.xScale();
    auto yScale = currentTransform.yScale();

    auto patternImage = Canvas::create(0, 0, patternRect.w * xScale, patternRect.h * yScale);
    auto patternImageTransform = Transform::scaled(xScale, yScale);

    const auto& viewBoxRect = attributes.viewBox();
    if(viewBoxRect.isValid()) {
        const auto& preserveAspectRatio = attributes.preserveAspectRatio();
        patternImageTransform.multiply(preserveAspectRatio.getTransform(viewBoxRect, patternRect.size()));
    } else if(attributes.patternContentUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternImageTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, patternImageTransform, SVGRenderMode::Painting, patternImage);
    patternContentElement->renderChildren(newState);

    auto patternTransform = attributes.patternTransform();
    patternTransform.translate(patternRect.x, patternRect.y);
    patternTransform.scale(1.f / xScale, 1.f / yScale);
    state->setTexture(*patternImage, TextureType::Tiled, opacity, patternTransform);
    return true;
}